

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

ostream * sqlite_orm::constraints::operator<<(ostream *os,foreign_key_action action)

{
  undefined4 in_ESI;
  ostream *in_RDI;
  
  switch(in_ESI) {
  case 0:
    break;
  case 1:
    std::operator<<(in_RDI,"NO ACTION");
    break;
  case 2:
    std::operator<<(in_RDI,"RESTRICT");
    break;
  case 3:
    std::operator<<(in_RDI,"SET NULL");
    break;
  case 4:
    std::operator<<(in_RDI,"SET DEFAULT");
    break;
  case 5:
    std::operator<<(in_RDI,"CASCADE");
  }
  return in_RDI;
}

Assistant:

inline std::ostream &operator<<(std::ostream &os, foreign_key_action action) {
    switch(action) {
        case decltype(action)::no_action:
            os << "NO ACTION";
            break;
        case decltype(action)::restrict_:
            os << "RESTRICT";
            break;
        case decltype(action)::set_null:
            os << "SET NULL";
            break;
        case decltype(action)::set_default:
            os << "SET DEFAULT";
            break;
        case decltype(action)::cascade:
            os << "CASCADE";
            break;
        case decltype(action)::none:
            break;
    }
    return os;
}